

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O3

char * http_lookup_type(char *path)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  char *__s;
  long lVar4;
  
  sVar2 = strlen(path);
  __s = ".ai";
  lVar4 = 0x10;
  while( true ) {
    sVar3 = strlen(__s);
    if ((sVar3 <= sVar2) && (iVar1 = nni_strcasecmp(path + (sVar2 - sVar3),__s), iVar1 == 0)) break;
    __s = *(char **)((long)&content_map[0].ext + lVar4);
    lVar4 = lVar4 + 0x10;
    if (lVar4 == 0x200) {
      return (char *)0x0;
    }
  }
  return *(char **)((long)&http_schemes[0xc].lower + lVar4);
}

Assistant:

const char *
http_lookup_type(const char *path)
{
	size_t l1 = strlen(path);
	for (int i = 0; content_map[i].ext != NULL; i++) {
		size_t l2 = strlen(content_map[i].ext);
		if (l2 > l1) {
			continue;
		}
		if (nni_strcasecmp(&path[l1 - l2], content_map[i].ext) == 0) {
			return (content_map[i].typ);
		}
	}
	return (NULL);
}